

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat0.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *__nptr;
  ggml_context *ctx0;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  undefined8 uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint local_74;
  ggml_tensor *x [2];
  int64_t ne [4];
  
  __nptr = getenv("GGML_NLOOP");
  if (__nptr == (char *)0x0) {
    local_74 = 500;
  }
  else {
    local_74 = atoi(__nptr);
  }
  if (1 < argc) {
    local_74 = atoi(argv[1]);
  }
  uVar7 = 0;
  if (0 < (int)local_74) {
    uVar7 = local_74;
  }
  uVar8 = 0;
  do {
    if ((uint)uVar8 == uVar7) {
      return 0;
    }
    printf("test-mul-mat0: iter:%d/%d\n",uVar8,(ulong)local_74);
    ctx0 = (ggml_context *)ggml_init();
    get_random_dims(ne,4);
    for (uVar9 = 2; uVar9 != 5; uVar9 = uVar9 + 1) {
      pgVar2 = get_random_tensor(ctx0,uVar9,ne,-1.0,1.0);
      x[0] = pgVar2;
      iVar1 = rand();
      ne[1] = (int64_t)(iVar1 % 4 + 1);
      pgVar3 = get_random_tensor(ctx0,uVar9,ne,-1.0,1.0);
      x[1] = pgVar3;
      ggml_set_param(ctx0,pgVar2);
      pgVar4 = (ggml_tensor *)ggml_mul_mat(ctx0,pgVar3,pgVar2);
      pgVar5 = (ggml_tensor *)ggml_sum(ctx0,pgVar4);
      printf("testing: mul_mat, [%ld, %ld, %ld, %ld] = [%ld, %ld, %ld, %ld] * [%ld, %ld, %ld, %ld]\n"
             ,pgVar4->ne[0],pgVar4->ne[1],pgVar4->ne[2],pgVar4->ne[3],pgVar3->ne[0],pgVar3->ne[1],
             pgVar3->ne[2],pgVar3->ne[3],pgVar2->ne[0],pgVar2->ne[1],pgVar2->ne[2],pgVar2->ne[3]);
      if (pgVar4->ne[0] != pgVar3->ne[1]) {
        __assert_fail("m->ne[0] == x[1]->ne[1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                      ,0x117,"int main(int, const char **)");
      }
      if (pgVar4->ne[1] != pgVar2->ne[1]) {
        __assert_fail("m->ne[1] == x[0]->ne[1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                      ,0x118,"int main(int, const char **)");
      }
      if (pgVar4->ne[2] != pgVar2->ne[2]) {
        __assert_fail("m->ne[2] == x[0]->ne[2]",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                      ,0x119,"int main(int, const char **)");
      }
      if (pgVar4->ne[3] != pgVar2->ne[3]) {
        __assert_fail("m->ne[3] == x[0]->ne[3]",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                      ,0x11a,"int main(int, const char **)");
      }
      if (uVar9 < 3) {
        check_gradient("mul_mat",ctx0,x,pgVar5,uVar9,1,0.001,0.001,INFINITY);
      }
      else {
        uVar6 = ggml_new_graph(ctx0);
        ggml_build_forward_expand(uVar6,pgVar4);
        ggml_graph_compute_with_ctx(ctx0,uVar6,1);
      }
      check_mat_mul(pgVar4,pgVar3,pgVar2);
    }
    for (uVar9 = 2; uVar9 != 5; uVar9 = uVar9 + 1) {
      pgVar2 = get_random_tensor(ctx0,uVar9,ne,-1.0,1.0);
      ne[1] = ne[0];
      x[0] = pgVar2;
      iVar1 = rand();
      ne[0] = (int64_t)(iVar1 % 4 + 1);
      pgVar3 = get_random_tensor(ctx0,uVar9,ne,-1.0,1.0);
      uVar6 = ggml_transpose(ctx0,pgVar3);
      pgVar3 = (ggml_tensor *)ggml_cont(ctx0,uVar6);
      x[1] = pgVar3;
      ggml_set_param(ctx0,pgVar2);
      pgVar4 = (ggml_tensor *)ggml_mul_mat(ctx0,pgVar3,pgVar2);
      pgVar5 = (ggml_tensor *)ggml_sum(ctx0,pgVar4);
      printf("testing: mul_mat, [%ld, %ld, %ld, %ld] = [%ld, %ld, %ld, %ld] * [%ld, %ld, %ld, %ld]\n"
             ,pgVar4->ne[0],pgVar4->ne[1],pgVar4->ne[2],pgVar4->ne[3],pgVar3->ne[0],pgVar3->ne[1],
             pgVar3->ne[2],pgVar3->ne[3],pgVar2->ne[0],pgVar2->ne[1],pgVar2->ne[2],pgVar2->ne[3]);
      if (pgVar4->ne[0] != pgVar3->ne[1]) {
        __assert_fail("m->ne[0] == x[1]->ne[1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                      ,0x13c,"int main(int, const char **)");
      }
      if (pgVar4->ne[1] != pgVar2->ne[1]) {
        __assert_fail("m->ne[1] == x[0]->ne[1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                      ,0x13d,"int main(int, const char **)");
      }
      if (pgVar4->ne[2] != pgVar2->ne[2]) {
        __assert_fail("m->ne[2] == x[0]->ne[2]",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                      ,0x13e,"int main(int, const char **)");
      }
      if (pgVar4->ne[3] != pgVar2->ne[3]) {
        __assert_fail("m->ne[3] == x[0]->ne[3]",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                      ,0x13f,"int main(int, const char **)");
      }
      if (uVar9 < 3) {
        check_gradient("mul_mat",ctx0,x,pgVar5,uVar9,1,0.001,0.001,INFINITY);
      }
      else {
        uVar6 = ggml_new_graph(ctx0);
        ggml_build_forward_expand(uVar6,pgVar4);
        ggml_graph_compute_with_ctx(ctx0,uVar6,1);
      }
      check_mat_mul(pgVar4,pgVar3,pgVar2);
    }
    ggml_free(ctx0);
    uVar8 = (ulong)((uint)uVar8 + 1);
  } while( true );
}

Assistant:

int main(int argc, const char ** argv) {
    struct ggml_init_params params = {
        .mem_size   = 128*1024*1024,
        .mem_buffer = NULL,
        .no_alloc   = false,
    };

    int64_t ne[4];

    // original loop: 500
    int niter = 500;
    const char *env = getenv("GGML_NLOOP");
    if (env != NULL) {
        niter = atoi(env);
    }
    if (argc > 1) {
        niter = atoi(argv[1]);
    }

    int n_threads = 1;

    for (int iter = 0; iter < niter; ++iter) {
        printf("test-mul-mat0: iter:%d/%d\n", iter, niter);
        struct ggml_context * ctx0 = ggml_init(params);

        get_random_dims(ne, 4);

        struct ggml_tensor * x[MAX_NARGS];

        // mul_mat
        {
            const int nargs = 1;

            for (int ndims = 2; ndims <= 4; ++ndims) {
                x[0] = get_random_tensor(ctx0, ndims, ne, -1.0f, 1.0f);
                ne[1] = rand()%4 + 1;
                x[1] = get_random_tensor(ctx0, ndims, ne, -1.0f, 1.0f);

                ggml_set_param(ctx0, x[0]);

                struct ggml_tensor * m = ggml_mul_mat(ctx0, x[1], x[0]);
                struct ggml_tensor * f = ggml_sum(ctx0, m);

                printf("testing: mul_mat, [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "] = [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "] * [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "]\n",
                           m->ne[0],    m->ne[1],    m->ne[2],    m->ne[3],
                        x[1]->ne[0], x[1]->ne[1], x[1]->ne[2], x[1]->ne[3],
                        x[0]->ne[0], x[0]->ne[1], x[0]->ne[2], x[0]->ne[3]);

                assert(m->ne[0] == x[1]->ne[1]);
                assert(m->ne[1] == x[0]->ne[1]);
                assert(m->ne[2] == x[0]->ne[2]);
                assert(m->ne[3] == x[0]->ne[3]);

                if (ndims <= 2) {
                    check_gradient("mul_mat", ctx0, x, f, ndims, nargs, 1e-3f, 1e-3f, INFINITY);
                } else {
                    struct ggml_cgraph * gf = ggml_new_graph(ctx0);
                    ggml_build_forward_expand(gf, m);
                    ggml_graph_compute_with_ctx(ctx0, gf, n_threads);
                }

                check_mat_mul(m, x[1], x[0]);
            }
        }

        // mul_mat (transposed)
        {
            const int nargs = 1;

            for (int ndims = 2; ndims <= 4; ++ndims) {
                x[0] = get_random_tensor(ctx0, ndims, ne, -1.0f, 1.0f);
                ne[1] = ne[0];
                ne[0] = rand()%4 + 1;
                x[1] = ggml_cont(ctx0, ggml_transpose(ctx0, get_random_tensor(ctx0, ndims, ne, -1.0f, 1.0f)));

                ggml_set_param(ctx0, x[0]);

                struct ggml_tensor * m = ggml_mul_mat(ctx0, x[1], x[0]);
                struct ggml_tensor * f = ggml_sum(ctx0, m);

                printf("testing: mul_mat, [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "] = [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "] * [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "]\n",
                           m->ne[0],    m->ne[1],    m->ne[2],    m->ne[3],
                        x[1]->ne[0], x[1]->ne[1], x[1]->ne[2], x[1]->ne[3],
                        x[0]->ne[0], x[0]->ne[1], x[0]->ne[2], x[0]->ne[3]);

                assert(m->ne[0] == x[1]->ne[1]);
                assert(m->ne[1] == x[0]->ne[1]);
                assert(m->ne[2] == x[0]->ne[2]);
                assert(m->ne[3] == x[0]->ne[3]);

                if (ndims <= 2) {
                    check_gradient("mul_mat", ctx0, x, f, ndims, nargs, 1e-3f, 1e-3f, INFINITY);
                } else {
                    struct ggml_cgraph * gf = ggml_new_graph(ctx0);
                    ggml_build_forward_expand(gf, m);
                    ggml_graph_compute_with_ctx(ctx0, gf, n_threads);
                }

                check_mat_mul(m, x[1], x[0]);
            }
        }
        ggml_free(ctx0);
    }

    return 0;
}